

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O3

void * __thiscall ncnn::UnlockedPoolAllocator::fastMalloc(UnlockedPoolAllocator *this,size_t size)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  int iVar3;
  UnlockedPoolAllocatorPrivate *pUVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  ulong uVar7;
  _List_node_base *p_Var8;
  void *ptr;
  _List_node_base *local_30;
  
  pUVar4 = this->d;
  p_Var5 = (pUVar4->budgets).
           super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  p_Var6 = p_Var5;
  p_Var8 = p_Var5;
  for (; p_Var5 != (_List_node_base *)&pUVar4->budgets; p_Var5 = p_Var5->_M_next) {
    p_Var2 = p_Var5[1]._M_next;
    if ((size <= p_Var2) && ((ulong)pUVar4->size_compare_ratio * (long)p_Var2 >> 8 <= size)) {
      p_Var6 = p_Var5[1]._M_prev;
      psVar1 = &(pUVar4->budgets).
                super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var5,0x20);
      pUVar4 = this->d;
      p_Var5 = (_List_node_base *)operator_new(0x20);
      p_Var5[1]._M_next = p_Var2;
      goto LAB_0013bcab;
    }
    if (p_Var6[1]._M_next < p_Var2) {
      p_Var6 = p_Var5;
    }
    if (p_Var2 < p_Var8[1]._M_next) {
      p_Var8 = p_Var5;
    }
  }
  uVar7 = (pUVar4->budgets).
          super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
          ._M_impl._M_node._M_size;
  if (pUVar4->size_drop_threshold <= uVar7) {
    if (p_Var6[1]._M_next < size) {
      p_Var5 = p_Var8[1]._M_prev;
      p_Var6 = p_Var8;
    }
    else {
      if (p_Var8[1]._M_next <= size) goto LAB_0013bc72;
      p_Var5 = p_Var6[1]._M_prev;
    }
    if (p_Var5 != (_List_node_base *)0x0) {
      free(p_Var5);
      pUVar4 = this->d;
      uVar7 = (pUVar4->budgets).
              super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
              ._M_impl._M_node._M_size;
    }
    (pUVar4->budgets).
    super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
    ._M_impl._M_node._M_size = uVar7 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var6,0x20);
  }
LAB_0013bc72:
  local_30 = (_List_node_base *)0x0;
  iVar3 = posix_memalign(&local_30,0x40,size + 0x40);
  p_Var6 = (_List_node_base *)0x0;
  if (iVar3 == 0) {
    p_Var6 = local_30;
  }
  pUVar4 = this->d;
  p_Var5 = (_List_node_base *)operator_new(0x20);
  p_Var5[1]._M_next = (_List_node_base *)size;
LAB_0013bcab:
  p_Var5[1]._M_prev = p_Var6;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar1 = &(pUVar4->payouts).
            super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return p_Var6;
}

Assistant:

void* UnlockedPoolAllocator::fastMalloc(size_t size)
{
    // find free budget
    std::list<std::pair<size_t, void*> >::iterator it = d->budgets.begin(), it_max = d->budgets.begin(), it_min = d->budgets.begin();
    for (; it != d->budgets.end(); ++it)
    {
        size_t bs = it->first;

        // size_compare_ratio ~ 100%
        if (bs >= size && ((bs * d->size_compare_ratio) >> 8) <= size)
        {
            void* ptr = it->second;

            d->budgets.erase(it);

            d->payouts.push_back(std::make_pair(bs, ptr));

            return ptr;
        }

        if (bs > it_max->first)
        {
            it_max = it;
        }
        if (bs < it_min->first)
        {
            it_min = it;
        }
    }

    if (d->budgets.size() >= d->size_drop_threshold)
    {
        if (it_max->first < size)
        {
            ncnn::fastFree(it_min->second);
            d->budgets.erase(it_min);
        }
        else if (it_min->first > size)
        {
            ncnn::fastFree(it_max->second);
            d->budgets.erase(it_max);
        }
    }

    // new
    void* ptr = ncnn::fastMalloc(size);

    d->payouts.push_back(std::make_pair(size, ptr));

    return ptr;
}